

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O2

int xmrig::CudaLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  undefined7 extraout_var;
  EVP_PKEY_CTX *in_RDX;
  char *dst;
  
  if (m_initialized == '\x01') {
    uVar2 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready);
  }
  else {
    dst = "libxmrig-cuda.so";
    if (ctx != (EVP_PKEY_CTX *)0x0) {
      dst = (char *)ctx;
    }
    String::copy((String *)&m_loader,(EVP_PKEY_CTX *)dst,in_RDX);
    iVar3 = uv_dlopen(m_loader,cudaLib);
    if (iVar3 == 0) {
      bVar1 = load();
      uVar2 = (uint)CONCAT71(extraout_var,bVar1);
    }
    else {
      uVar2 = 0;
    }
    m_ready = (undefined1)uVar2;
    m_initialized = '\x01';
  }
  return uVar2 & 0xffffff01;
}

Assistant:

bool xmrig::CudaLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName == nullptr ? defaultLoader() : fileName;
        m_ready       = uv_dlopen(m_loader, &cudaLib) == 0 && load();
        m_initialized = true;
    }

    return m_ready;
}